

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::base::Writer::triggerDispatch(Writer *this)

{
  Level level;
  LineNumber line;
  Logger *pLVar1;
  Writer *pWVar2;
  ostream *poVar3;
  allocator<char> local_262;
  allocator<char> local_261;
  string local_260;
  string local_240;
  LogMessage local_220;
  stringstream reasonStream;
  undefined1 local_198 [8];
  _Alloc_hider local_190;
  LineNumber LStack_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  Logger *local_170;
  bool local_168;
  Logger *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  pointer local_148;
  Logger *pLStack_140;
  _Alloc_hider local_138;
  
  if (this->m_proceed == true) {
    level = this->m_level;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,this->m_file,&local_261)
    ;
    line = this->m_line;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,this->m_func,&local_262)
    ;
    LogMessage::LogMessage
              (&local_220,level,&local_240,line,&local_260,this->m_verboseLevel,this->m_logger);
    LogDispatcher::LogDispatcher
              ((LogDispatcher *)&reasonStream,true,&local_220,this->m_dispatchAction);
    LogDispatcher::dispatch((LogDispatcher *)&reasonStream);
    LogMessage::~LogMessage((LogMessage *)local_198);
    LogMessage::~LogMessage(&local_220);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_240);
  }
  pLVar1 = this->m_logger;
  if (pLVar1 != (Logger *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reasonStream,"",(allocator<char> *)&local_220);
    std::__cxx11::stringbuf::str((string *)&pLVar1->field_0x58);
    std::__cxx11::string::~string((string *)&reasonStream);
    (*(this->m_logger->super_ThreadSafe)._vptr_ThreadSafe[1])();
  }
  if (((this->m_proceed == true) && (this->m_level == Fatal)) &&
     ((*(byte *)(elStorage + 0x20) & 8) == 0)) {
    local_190._M_p = this->m_file;
    LStack_188 = this->m_line;
    local_180._M_allocated_capacity = (size_type)this->m_func;
    _reasonStream = &PTR__Writer_001ea4f0;
    local_198._0_4_ = Warning;
    local_180._8_2_ = 0;
    local_170 = (Logger *)0x0;
    local_168 = false;
    local_160 = (Logger *)0x0;
    local_158._M_allocated_capacity =
         (long)"All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n" +
         0x4d;
    local_158._8_4_ = 2;
    local_148 = (pointer)0x0;
    pLStack_140 = (Logger *)0x0;
    local_138._M_p = (pointer)0x0;
    construct((Writer *)&reasonStream,1,"default");
    pWVar2 = operator<<((Writer *)&reasonStream,
                        (char (*) [45])"Aborting application. Reason: Fatal log at [");
    pWVar2 = operator<<(pWVar2,&this->m_file);
    pWVar2 = operator<<(pWVar2,(char (*) [2])0x1aaf24);
    pWVar2 = operator<<(pWVar2,&this->m_line);
    operator<<(pWVar2,(char (*) [2])0x1a81ae);
    ~Writer((Writer *)&reasonStream);
    std::__cxx11::stringstream::stringstream((stringstream *)&reasonStream);
    poVar3 = std::operator<<((ostream *)&local_190,"Fatal log at [");
    poVar3 = std::operator<<(poVar3,this->m_file);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"]");
    poVar3 = std::operator<<(poVar3," If you wish to disable \'abort on fatal log\' please use ");
    std::operator<<(poVar3,
                    "el::Helpers::addFlag(el::LoggingFlag::DisableApplicationAbortOnFatalLog)");
    std::__cxx11::stringbuf::str();
    abort();
  }
  this->m_proceed = false;
  return;
}

Assistant:

void Writer::triggerDispatch(void) {
  if (m_proceed) {
    base::LogDispatcher(m_proceed, LogMessage(m_level, m_file, m_line, m_func, m_verboseLevel,
                        m_logger), m_dispatchAction).dispatch();
  }
  if (m_logger != nullptr) {
    m_logger->stream().str(ELPP_LITERAL(""));
    m_logger->releaseLock();
  }
  if (m_proceed && m_level == Level::Fatal
      && !ELPP->hasFlag(LoggingFlag::DisableApplicationAbortOnFatalLog)) {
    base::Writer(Level::Warning, m_file, m_line, m_func).construct(1, base::consts::kDefaultLoggerId)
        << "Aborting application. Reason: Fatal log at [" << m_file << ":" << m_line << "]";
    std::stringstream reasonStream;
    reasonStream << "Fatal log at [" << m_file << ":" << m_line << "]"
                 << " If you wish to disable 'abort on fatal log' please use "
                 << "el::Helpers::addFlag(el::LoggingFlag::DisableApplicationAbortOnFatalLog)";
    base::utils::abort(1, reasonStream.str());
  }
  m_proceed = false;
}